

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsav(bifcxdef *ctx,int argc)

{
  long lVar1;
  long in_RDI;
  runsdef val;
  int err;
  char buf [4096];
  uchar *fn;
  undefined8 in_stack_ffffffffffffefb8;
  runcxdef *in_stack_ffffffffffffefc0;
  runsdef *val_00;
  char *ext;
  dattyp typ;
  runcxdef *in_stack_ffffffffffffefd0;
  uchar *in_stack_ffffffffffffefd8;
  undefined4 in_stack_ffffffffffffefe0;
  undefined4 in_stack_ffffffffffffefe4;
  char *in_stack_ffffffffffffefe8;
  anon_union_8_4_1dda36f5_for_runsv in_stack_ffffffffffffeff0;
  char *in_stack_fffffffffffff038;
  char *in_stack_fffffffffffff040;
  voccxdef *in_stack_fffffffffffff048;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffefc0,(int)((ulong)in_stack_ffffffffffffefb8 >> 0x20));
  }
  ext = *(char **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  bifcstr((bifcxdef *)in_stack_ffffffffffffeff0.runsvstr,in_stack_ffffffffffffefe8,
          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),in_stack_ffffffffffffefd8);
  val_00 = (runsdef *)&stack0xffffffffffffefe8;
  os_defext((char *)in_stack_ffffffffffffefd0,ext);
  typ = (dattyp)((ulong)ext >> 0x20);
  fiosav(in_stack_fffffffffffff048,in_stack_fffffffffffff040,in_stack_fffffffffffff038);
  runpush(in_stack_ffffffffffffefd0,typ,val_00);
  return;
}

Assistant:

void bifsav(bifcxdef *ctx, int argc)
{
    uchar   *fn;
    char     buf[OSFNMAX];
    int      err;
    runsdef  val;
    
    bifcntargs(ctx, 1, argc);
    fn = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, buf, (size_t)sizeof(buf), fn);
    os_defext(buf, ctx->bifcxsavext != 0 ? ctx->bifcxsavext : "sav");
    err = fiosav(ctx->bifcxrun->runcxvoc, buf, ctx->bifcxrun->runcxgamename);
    runpush(ctx->bifcxrun, runclog(err), &val);
}